

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcMasterTable.cpp
# Opt level: O1

void __thiscall
GrcMasterValueList::AddItem
          (GrcMasterValueList *this,Symbol psym,GdlExpression *pexpValue,int nPR,int munitPR,
          bool fOverride,GrpLineAndFile *lnf,string *staDescription)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  GdlAssignment *pGVar3;
  _Base_ptr p_Var4;
  GdlObject *pgdlObj;
  _Base_ptr p_Var5;
  ValuePair hmpair;
  string local_88;
  string local_68;
  pair<GrcSymbolTableEntry_*,_GdlAssignment_*> local_48;
  
  p_Var1 = &(this->m_valmapEntries)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->m_valmapEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[*(Symbol *)(p_Var5 + 1) < psym]) {
    if (*(Symbol *)(p_Var5 + 1) >= psym) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) && (p_Var5 = p_Var4, psym < *(Symbol *)(p_Var4 + 1))) {
    p_Var5 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var5 == p_Var1) {
    pGVar3 = (GdlAssignment *)operator_new(0x48);
    (pGVar3->super_GrcAssignment)._vptr_GrcAssignment = (_func_int **)&PTR__GrcAssignment_00241df0;
    (pGVar3->super_GrcAssignment).m_pexp = pexpValue;
    (pGVar3->super_GrcAssignment).m_nPointRadius = nPR;
    (pGVar3->super_GrcAssignment).m_mPrUnits = munitPR;
    (pGVar3->super_GrcAssignment).m_fOverride = fOverride;
    (pGVar3->super_GrcAssignment).m_fShadow = false;
    GrpLineAndFile::GrpLineAndFile(&(pGVar3->super_GrcAssignment).m_lnf,lnf);
    (pGVar3->super_GrcAssignment)._vptr_GrcAssignment = (_func_int **)&PTR__GdlAssignment_00242c18;
    local_48.first = psym;
    local_48.second = pGVar3;
    std::
    _Rb_tree<GrcSymbolTableEntry*,std::pair<GrcSymbolTableEntry*const,GdlAssignment*>,std::_Select1st<std::pair<GrcSymbolTableEntry*const,GdlAssignment*>>,std::less<GrcSymbolTableEntry*>,std::allocator<std::pair<GrcSymbolTableEntry*const,GdlAssignment*>>>
    ::_M_emplace_unique<std::pair<GrcSymbolTableEntry*,GdlAssignment*>&>
              ((_Rb_tree<GrcSymbolTableEntry*,std::pair<GrcSymbolTableEntry*const,GdlAssignment*>,std::_Select1st<std::pair<GrcSymbolTableEntry*const,GdlAssignment*>>,std::less<GrcSymbolTableEntry*>,std::allocator<std::pair<GrcSymbolTableEntry*const,GdlAssignment*>>>
                *)this,&local_48);
  }
  else {
    p_Var5 = p_Var5[1]._M_parent;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Duplicate ","");
    pcVar2 = (staDescription->_M_dataplus)._M_p;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar2,pcVar2 + staDescription->_M_string_length);
    pgdlObj = &pexpValue->super_GdlObject;
    if (pexpValue == (GdlExpression *)0x0) {
      pgdlObj = (GdlObject *)0x0;
    }
    GrcErrorList::AddItem
              (&g_errorList,false,0x9dc,pgdlObj,(GrpLineAndFile *)0x0,&local_88,&local_68,
               (string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (((int)p_Var5[1]._M_color < lnf->m_nLinePre && fOverride) ||
       ((lnf->m_nLinePre < (int)p_Var5[1]._M_color && (*(char *)&p_Var5->_M_right == '\0')))) {
      (**(code **)(*(long *)p_Var5 + 0x10))(p_Var5,pexpValue,nPR,munitPR,fOverride,lnf);
    }
  }
  return;
}

Assistant:

void GrcMasterValueList::AddItem(Symbol psym, GdlExpression * pexpValue,
	int nPR, int munitPR, bool fOverride, GrpLineAndFile const& lnf,
	std::string staDescription)
{
	GdlAssignment * pasgn;
	
	ValueMap::iterator hmit = m_valmapEntries.find(psym);
	if (hmit == m_valmapEntries.end())
	//if (!m_valmapEntries.Retrieve(psym, &pasgn) || !pasgn)
	{
		pasgn = new GdlAssignment(pexpValue, nPR, munitPR, fOverride, lnf);
		ValuePair hmpair;
		hmpair.first = psym;
		hmpair.second = pasgn;
		m_valmapEntries.insert(hmpair);
		//m_valmapEntries.Insert(psym, pasgn);
	}
	else
	{
		pasgn = hmit->second;
		g_errorList.AddWarning(2524, pexpValue,
			"Duplicate ", staDescription);
		
		if ((lnf.PreProcessedLine() > pasgn->PreProcessedLine() && fOverride) ||
			(lnf.PreProcessedLine() < pasgn->PreProcessedLine() && !pasgn->Override()))
		{
			pasgn->Set(pexpValue, nPR, munitPR, fOverride, lnf);
		}
	}
}